

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O2

Promise<kj::AuthenticatedStream> __thiscall
kj::TlsConnectionReceiver::acceptAuthenticated(TlsConnectionReceiver *this)

{
  long in_RSI;
  Exception local_1a0;
  
  if (*(char *)(in_RSI + 0xb0) == '\x01') {
    Exception::Exception(&local_1a0,(Exception *)(in_RSI + 0xb8));
    Promise<kj::AuthenticatedStream>::Promise((Promise<kj::AuthenticatedStream> *)this,&local_1a0);
    Exception::~Exception(&local_1a0);
  }
  else {
    ProducerConsumerQueue<kj::AuthenticatedStream>::pop
              ((ProducerConsumerQueue<kj::AuthenticatedStream> *)this);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> acceptAuthenticated() override {
    KJ_IF_SOME(e, maybeInnerException) {
      // We've experienced an exception from the inner receiver, we consider this unrecoverable.
      return Exception(e);
    }

    return queue.pop();
  }